

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::RuleTests_RemainingSpanWithNT_Test::TestBody(RuleTests_RemainingSpanWithNT_Test *this)

{
  char *in_RCX;
  char *message;
  string_view line;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  AssertHelper local_108;
  AssertionResult gtest_ar;
  Span s;
  AlignedSentencePair asp;
  PhrasalRule rule;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"a c e\tb d f\t0-0 1-1 2-2";
  readAlignedSentencePair<false,false>(&asp,(thrax *)0x17,line);
  PhrasalRule::PhrasalRule(&rule,&asp);
  NT::NT((NT *)&gtest_ar,(SpanPair)0x2000100020001);
  rule.nts._M_elems[0].label._M_len = (size_t)gtest_ar.message_.ptr_;
  rule.nextNT = rule.nextNT + 1;
  s.start = 2;
  s.end = 3;
  local_110.ptr_._0_4_ = PhrasalRule::remainingSource(&rule);
  testing::internal::CmpHelperEQ<jhu::thrax::Span,jhu::thrax::Span>
            ((internal *)&gtest_ar,"s","rule.remainingSource()",&s,(Span *)&local_110);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_110);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/rule_test.cpp"
               ,0x14,message);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_110);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AlignedSentencePair::~AlignedSentencePair(&asp);
  return;
}

Assistant:

TEST(RuleTests, RemainingSpanWithNT) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  SpanPair nt{{1, 2}, {1, 2}};
  rule.nts.front() = nt;
  rule.nextNT++;
  Span s{2, 3};
  EXPECT_EQ(s, rule.remainingSource());
}